

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

StringPtr * __thiscall
kj::Vector<kj::StringPtr>::add<kj::StringPtr&>(Vector<kj::StringPtr> *this,StringPtr *params)

{
  bool bVar1;
  StringPtr *pSVar2;
  StringPtr *params_local;
  Vector<kj::StringPtr> *this_local;
  
  bVar1 = ArrayBuilder<kj::StringPtr>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pSVar2 = fwd<kj::StringPtr&>(params);
  pSVar2 = ArrayBuilder<kj::StringPtr>::add<kj::StringPtr&>(&this->builder,pSVar2);
  return pSVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }